

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo_Location::Clear(SourceCodeInfo_Location *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  SourceCodeInfo_Location *this_local;
  
  if ((this->_has_bits_[0] & 0x3fc) != 0) {
    bVar1 = has_leading_comments(this);
    if ((bVar1) && (this->leading_comments_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    bVar1 = has_trailing_comments(this);
    if ((bVar1) && (this->trailing_comments_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
  }
  RepeatedField<int>::Clear(&this->path_);
  RepeatedField<int>::Clear(&this->span_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void SourceCodeInfo_Location::Clear() {
  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    if (has_leading_comments()) {
      if (leading_comments_ != &::google::protobuf::internal::kEmptyString) {
        leading_comments_->clear();
      }
    }
    if (has_trailing_comments()) {
      if (trailing_comments_ != &::google::protobuf::internal::kEmptyString) {
        trailing_comments_->clear();
      }
    }
  }
  path_.Clear();
  span_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}